

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::RelOp> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::RelOp>(RecursiveDescentParser *this)

{
  element_type *peVar1;
  socklen_t *psVar2;
  uint *__addr_len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::RelOp> sVar4;
  allocator local_51;
  string local_50 [55];
  undefined1 local_19;
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::RelOp> *pResult;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<MyCompiler::RelOp>();
  if ((((in_RSI->sym == EQL) || (in_RSI->sym == NEQ)) || (in_RSI->sym == LSS)) ||
     (((in_RSI->sym == LEQ || (in_RSI->sym == GTR)) || (in_RSI->sym == GEQ)))) {
    psVar2 = (socklen_t *)(ulong)(in_RSI->sym - EQL);
    __addr_len = &switchD_0010713a::switchdataD_00123040;
    switch(psVar2) {
    case (socklen_t *)0x0:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"=");
      __addr = extraout_RDX;
      break;
    case (socklen_t *)0x1:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"#");
      __addr = extraout_RDX_00;
      break;
    case (socklen_t *)0x2:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"<");
      __addr = extraout_RDX_01;
      break;
    case (socklen_t *)0x3:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,"<=");
      __addr = extraout_RDX_02;
      break;
    case (socklen_t *)0x4:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,">");
      __addr = extraout_RDX_03;
      break;
    default:
      peVar1 = std::__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::__cxx11::string::operator=((string *)&(peVar1->super_AbstractAstNode).value,">=");
      __addr_len = psVar2;
      __addr = extraout_RDX_04;
    }
    accept(in_RSI,in_RSI->sym,__addr,__addr_len);
    _Var3._M_pi = extraout_RDX_05;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"relational operator expected",&local_51);
    except(in_RSI,EQL,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    _Var3._M_pi = extraout_RDX_06;
  }
  sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::RelOp>)
         sVar4.super___shared_ptr<MyCompiler::RelOp,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::RelOp> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<RelOp>();

    if (sym == SymbolType::EQL || sym == SymbolType::NEQ || sym == SymbolType::LSS
        || sym == SymbolType::LEQ || sym == SymbolType::GTR || sym == SymbolType::GEQ)
    {
        switch (sym)
        {
            case SymbolType::EQL:
                pResult->value = "=";
                break;
            case SymbolType::NEQ:
                pResult->value = "#";
                break;
            case SymbolType::LSS:
                pResult->value = "<";
                break;
            case SymbolType::LEQ:
                pResult->value = "<=";
                break;
            case SymbolType::GTR:
                pResult->value = ">";
                break;
            default: // case SymbolType::GEQ:
                pResult->value = ">=";
        }
        accept(sym);
    }
    else
        except(SymbolType::EQL, "relational operator expected");

    return pResult;
}